

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void envy_bios_print_mem_unk0d(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = (bios->mem).unk0d.offset;
  if ((mask >> 0xc & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->mem).unk0d.version;
  if ((bios->mem).unk0d.valid != '\0') {
    fprintf((FILE *)out,"UNK0D table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(uint)(bios->mem).unk0d.offset,(uint)(bios->mem).unk0d.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->mem).unk0d.entriesnum != '\0') {
      uVar2 = 0;
      do {
        envy_bios_dump_hex(bios,out,(uint)(bios->mem).unk0d.entries[uVar2].offset,
                           (uint)(bios->mem).unk0d.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (bios->mem).unk0d.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse UNK0D table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
  return;
}

Assistant:

void envy_bios_print_mem_unk0d(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_unk0d *unk0d = &bios->mem.unk0d;
	int i;

	if (!unk0d->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;
	if (!unk0d->valid) {
		fprintf(out, "Failed to parse UNK0D table at 0x%x, version %x\n", unk0d->offset, unk0d->version);
		return;
	}

	fprintf(out, "UNK0D table at 0x%x, version %x\n", unk0d->offset, unk0d->version);
	envy_bios_dump_hex(bios, out, unk0d->offset, unk0d->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk0d->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk0d->entries[i].offset, unk0d->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}